

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

void __thiscall AddrManImpl::Unserialize<DataStream>(AddrManImpl *this,DataStream *s_)

{
  uint256 *nKey;
  vector<int,_std::allocator<int>_> *this_00;
  unordered_map<int,_AddrInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_AddrInfo>_>_>
  *puVar1;
  unordered_map<CService,_int,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_int>_>_>
  *this_01;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  *this_02;
  int *__args;
  mapped_type mVar2;
  iterator iVar3;
  _Hash_node_base *p_Var4;
  ushort uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  _Hash_node_base *p_Var9;
  undefined8 uVar10;
  bool bVar11;
  Network NVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  _Node_const_iterator<std::pair<const_int,_AddrInfo>,_false,_false> __tmp;
  mapped_type *pmVar16;
  key_type *pkVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  Logger *pLVar20;
  ulong uVar21;
  string *psVar22;
  int iVar23;
  size_t in_RCX;
  SerParams *__nbytes;
  int (*paiVar24) [64];
  undefined4 uVar25;
  int *in_R8;
  LogFlags in_R9;
  int *piVar26;
  long in_FS_OFFSET;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  int check_code;
  int nLostUnk;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bucket_entries;
  int nLost;
  uint8_t lowest_compatible;
  uint8_t compat;
  ParamsStream<DataStream_&,_CAddress::SerParams> s;
  SerParams ser_params;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  int entry_index;
  uint256 serialized_asmap_checksum;
  uint256 supplied_asmap_checksum;
  Level in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 uVar29;
  undefined4 uVar30;
  AddrManImpl *this_03;
  AddrManImpl *args;
  int (*args_1) [64];
  int local_170;
  int local_16c;
  undefined1 local_168 [16];
  long local_158;
  int local_148;
  byte local_142;
  byte local_141;
  ParamsStream<DataStream_&,_CAddress::SerParams> local_140;
  SerParams local_130;
  unique_lock<std::mutex> local_128;
  string local_118;
  undefined1 local_f8 [5];
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  undefined1 local_e8 [16];
  direct_or_indirect local_d8;
  undefined4 local_c8;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  uint16_t local_b8;
  rep local_b0;
  ServiceFlags SStack_a8;
  rep local_a0;
  rep rStack_98;
  direct_or_indirect local_90;
  uint local_80;
  undefined8 local_78;
  NodeSeconds local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_128._M_owns = false;
  local_128._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_128);
  if ((this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __assert_fail("vRandom.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                  ,0xeb,"void AddrManImpl::Unserialize(Stream &) [Stream = DataStream]");
  }
  local_d8.indirect_contents.indirect = (char *)0x0;
  DataStream::read(s_,(int)&local_d8,(void *)0x1,in_RCX);
  uVar29 = CONCAT13(local_d8.direct[0],(int3)in_stack_fffffffffffffe40);
  local_130._1_7_ = 0;
  local_130.super_SerParams.enc._0_1_ = 2 < (byte)local_d8.direct[0];
  __nbytes = &local_130;
  local_140.m_params = __nbytes;
  local_140.m_substream = s_;
  DataStream::read(s_,(int)&local_d8,(void *)0x1,(size_t)__nbytes);
  local_141 = local_d8.direct[0];
  if ((byte)local_d8.direct[0] < 0x20) {
    psVar22 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_char,unsigned_char>
              ((string *)&local_d8.indirect_contents,
               (tinyformat *)
               "Corrupted addrman database: The compat value (%u) is lower than the expected minimum value %u."
               ,(char *)&local_141,
               " /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/banman.cpp"
               ,(uchar *)in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar22);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar22,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    local_142 = local_d8.direct[0] - 0x20;
    if (local_142 < 5) {
      nKey = &this->nKey;
      DataStream::read(local_140.m_substream,(int)nKey,(void *)0x20,(size_t)__nbytes);
      DataStream::read(local_140.m_substream,(int)&local_d8,(void *)0x4,(size_t)__nbytes);
      this->nNew = local_d8._0_4_;
      DataStream::read(local_140.m_substream,(int)&local_d8,(void *)0x4,(size_t)__nbytes);
      paiVar24 = (int (*) [64])&this->nTried;
      *(undefined4 *)paiVar24 = local_d8._0_4_;
      DataStream::read(local_140.m_substream,(int)&local_d8,(void *)0x4,(size_t)paiVar24);
      piVar26 = &this->nNew;
      uVar30 = local_d8._0_4_ ^ 0x40000000;
      if ((char)((uint)uVar29 >> 0x18) == '\0') {
        uVar30 = local_d8._0_4_;
      }
      if ((uint)*piVar26 < 0x10001) {
        if ((uint)(*paiVar24)[0] < 0x4001) {
          this_00 = &this->vRandom;
          auVar6._12_4_ = 0;
          auVar6._0_12_ = stack0xffffffffffffff0c;
          _local_f8 = auVar6 << 0x20;
          iVar13 = *piVar26;
          if (0 < iVar13) {
            puVar1 = &this->mapInfo;
            this_01 = &this->mapAddr;
            this_02 = &this->m_network_counts;
            do {
              pmVar16 = std::__detail::
                        _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)puVar1,(key_type *)local_f8);
              local_d8.indirect_contents.indirect = (char *)&pmVar16->m_last_success;
              in_R8 = &pmVar16->nAttempts;
              ActionUnserialize::
              SerReadWriteMany<ParamsStream<DataStream&,CAddress::SerParams>,CAddress&,CNetAddr&,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>,int&>
                        (&local_140,&pmVar16->super_CAddress,&pmVar16->source,
                         (Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                          *)&local_d8.indirect_contents,in_R8);
              uVar25 = local_f8._0_4_;
              pkVar17 = (key_type *)
                        std::__detail::
                        _Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)this_01,(key_type *)pmVar16);
              *pkVar17 = uVar25;
              iVar3._M_current =
                   (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pmVar16->nRandomPos =
                   (int)((ulong)((long)iVar3._M_current -
                                (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2);
              if (iVar3._M_current ==
                  (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)this_00,iVar3,(int *)local_f8);
              }
              else {
                *iVar3._M_current = local_f8._0_4_;
                (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              NVar12 = CNetAddr::GetNetwork((CNetAddr *)pmVar16);
              local_d8._0_4_ = NVar12;
              pmVar18 = std::__detail::
                        _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)this_02,(key_type *)local_d8.direct);
              pmVar18->n_new = pmVar18->n_new + 1;
              iVar23 = local_f8._0_4_ + NET_IPV4;
              local_f8._0_4_ = iVar23;
              iVar13 = *piVar26;
            } while (iVar23 < iVar13);
          }
          this->nIdCount = iVar13;
          local_148 = 0;
          iVar13 = this->nTried;
          this_03 = this;
          if (0 < iVar13) {
            __args = &this->nIdCount;
            iVar23 = 0;
            do {
              AddrInfo::AddrInfo((AddrInfo *)&local_d8.indirect_contents);
              _local_f8 = &local_70;
              in_R8 = (int *)&uStack_68;
              ActionUnserialize::
              SerReadWriteMany<ParamsStream<DataStream&,CAddress::SerParams>,CAddress&,CNetAddr&,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>,int&>
                        (&local_140,(CAddress *)&local_d8.indirect_contents,
                         (CNetAddr *)&local_90.indirect_contents,
                         (Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                          *)local_f8,in_R8);
              iVar13 = AddrInfo::GetTriedBucket
                                 ((AddrInfo *)&local_d8.indirect_contents,nKey,
                                  this_03->m_netgroupman);
              uVar14 = AddrInfo::GetBucketPosition
                                 ((AddrInfo *)&local_d8.indirect_contents,nKey,false,iVar13);
              bVar11 = CNetAddr::IsValid((CNetAddr *)&local_d8.indirect_contents);
              if (bVar11) {
                lVar8 = (ulong)(uint)(iVar13 << 8) + 0x174;
                if (*(int *)((long)this->vvTried[0] + (ulong)uVar14 * 4 + lVar8 + -0x174) != -1)
                goto LAB_00458374;
                iVar3._M_current =
                     (this_03->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                uStack_5c = (undefined4)
                            ((ulong)((long)iVar3._M_current -
                                    (long)(this_03->vRandom).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2);
                local_60 = CONCAT31(local_60._1_3_,1);
                if (iVar3._M_current ==
                    (this_03->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)this_00,iVar3,__args);
                }
                else {
                  *iVar3._M_current = this_03->nIdCount;
                  (this_03->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                pmVar16 = std::__detail::
                          _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&this->mapInfo,__args);
                prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                          ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)pmVar16,
                           (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                           &local_d8.indirect_contents);
                uVar25 = CONCAT13(cStack_bd,CONCAT12(cStack_be,CONCAT11(cStack_bf,cStack_c0)));
                (pmVar16->super_CAddress).super_CService.super_CNetAddr.m_net = uVar25;
                (pmVar16->super_CAddress).super_CService.super_CNetAddr.m_scope_id =
                     (int)(CONCAT17(cStack_b9,
                                    CONCAT16(cStack_ba,
                                             CONCAT15(cStack_bb,CONCAT14(cStack_bc,uVar25)))) >>
                          0x20);
                (pmVar16->super_CAddress).super_CService.port = local_b8;
                (pmVar16->super_CAddress).nTime.__d.__r = local_b0;
                (pmVar16->super_CAddress).nServices = SStack_a8;
                (pmVar16->m_last_try).__d.__r = local_a0;
                (pmVar16->m_last_count_attempt).__d.__r = rStack_98;
                prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                          (&(pmVar16->source).m_addr,
                           (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                           &local_90.indirect_contents);
                (pmVar16->source).m_net = (undefined4)local_78;
                (pmVar16->source).m_scope_id = local_78._4_4_;
                (pmVar16->m_last_success).__d.__r = (rep)local_70.__d.__r;
                pmVar16->nAttempts = (undefined4)uStack_68;
                pmVar16->nRefCount = uStack_68._4_4_;
                pmVar16->fInTried = (bool)(char)local_60;
                *(int3 *)&pmVar16->field_0x79 = (int3)((uint)local_60 >> 8);
                pmVar16->nRandomPos = uStack_5c;
                mVar2 = *__args;
                pmVar19 = std::__detail::
                          _Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&this->mapAddr,(key_type *)&local_d8.indirect_contents);
                *pmVar19 = mVar2;
                iVar13 = *__args;
                *(int *)((long)this->vvTried[0] + (ulong)uVar14 * 4 + lVar8 + -0x174) = iVar13;
                *__args = iVar13 + 1;
                NVar12 = CNetAddr::GetNetwork((CNetAddr *)&local_d8.indirect_contents);
                local_f8._0_4_ = NVar12;
                pmVar18 = std::__detail::
                          _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&this->m_network_counts,(key_type *)local_f8);
                pmVar18->n_tried = pmVar18->n_tried + 1;
              }
              else {
LAB_00458374:
                local_148 = local_148 + 1;
              }
              if (0x10 < local_80) {
                free(local_90.indirect_contents.indirect);
                local_90.indirect_contents.indirect = (char *)0x0;
              }
              if (0x10 < local_c8) {
                free(local_d8.indirect_contents.indirect);
                local_d8.indirect_contents.indirect = (char *)0x0;
              }
              iVar23 = iVar23 + 1;
              iVar13 = (*paiVar24)[0];
            } while (iVar23 < iVar13);
          }
          iVar23 = (int)in_R8;
          (*paiVar24)[0] = iVar13 - local_148;
          local_168 = (undefined1  [16])0x0;
          local_158 = 0;
          auVar7._12_4_ = 0;
          auVar7._0_12_ = stack0xffffffffffffff0c;
          _local_f8 = auVar7 << 0x20;
          args_1 = paiVar24;
          if (0 < (int)uVar30) {
            do {
              DataStream::read(local_140.m_substream,(int)&local_d8,(void *)0x4,(size_t)paiVar24);
              uVar25 = local_d8._0_4_;
              if (0 < (int)local_d8._0_4_) {
                do {
                  local_118._M_dataplus._M_p._0_4_ = 0;
                  DataStream::read(local_140.m_substream,(int)&local_d8,(void *)0x4,(size_t)paiVar24
                                  );
                  local_118._M_dataplus._M_p._0_4_ = local_d8._0_4_;
                  if ((-1 < (int)local_d8._0_4_) && ((int)local_d8._0_4_ < *piVar26)) {
                    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    emplace_back<int&,int&>
                              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                               local_168,(int *)local_f8,(int *)&local_118);
                  }
                  uVar25 = uVar25 + -1;
                } while (uVar25 != 0);
              }
              iVar23 = (int)in_R8;
              iVar13 = local_f8._0_4_ + NET_IPV4;
              local_f8._0_4_ = iVar13;
            } while (iVar13 < (int)uVar30);
          }
          NetGroupManager::GetAsmapChecksum
                    ((uint256 *)&local_d8.indirect_contents,this_03->m_netgroupman);
          local_e8 = (undefined1  [16])0x0;
          _local_f8 = (undefined1  [16])0x0;
          if (1 < (byte)((uint)uVar29 >> 0x18)) {
            DataStream::read(local_140.m_substream,(int)local_f8,(void *)0x20,(size_t)paiVar24);
          }
          if (uVar30 == 0x400) {
            auVar28[0] = -((char)local_c8 == local_e8[0]);
            auVar28[1] = -(local_c8._1_1_ == local_e8[1]);
            auVar28[2] = -(local_c8._2_1_ == local_e8[2]);
            auVar28[3] = -(local_c8._3_1_ == local_e8[3]);
            auVar28[4] = -(cStack_c4 == local_e8[4]);
            auVar28[5] = -(cStack_c3 == local_e8[5]);
            auVar28[6] = -(cStack_c2 == local_e8[6]);
            auVar28[7] = -(cStack_c1 == local_e8[7]);
            auVar28[8] = -(cStack_c0 == local_e8[8]);
            auVar28[9] = -(cStack_bf == local_e8[9]);
            auVar28[10] = -(cStack_be == local_e8[10]);
            auVar28[0xb] = -(cStack_bd == local_e8[0xb]);
            auVar28[0xc] = -(cStack_bc == local_e8[0xc]);
            auVar28[0xd] = -(cStack_bb == local_e8[0xd]);
            auVar28[0xe] = -(cStack_ba == local_e8[0xe]);
            auVar28[0xf] = -(cStack_b9 == local_e8[0xf]);
            auVar27[0] = -(local_d8.direct[0] == local_f8[0]);
            auVar27[1] = -(local_d8.direct[1] == local_f8[1]);
            auVar27[2] = -(local_d8.direct[2] == local_f8[2]);
            auVar27[3] = -(local_d8.direct[3] == local_f8[3]);
            auVar27[4] = -(local_d8.direct[4] == local_f8[4]);
            auVar27[5] = -(local_d8.direct[5] == cStack_f3);
            auVar27[6] = -(local_d8.direct[6] == cStack_f2);
            auVar27[7] = -(local_d8.direct[7] == cStack_f1);
            auVar27[8] = -(local_d8.direct[8] == cStack_f0);
            auVar27[9] = -(local_d8.direct[9] == cStack_ef);
            auVar27[10] = -(local_d8.direct[10] == cStack_ee);
            auVar27[0xb] = -(local_d8.direct[0xb] == cStack_ed);
            auVar27[0xc] = -(local_d8.direct[0xc] == cStack_ec);
            auVar27[0xd] = -(local_d8.direct[0xd] == cStack_eb);
            auVar27[0xe] = -(local_d8.direct[0xe] == cStack_ea);
            auVar27[0xf] = -(local_d8.direct[0xf] == cStack_e9);
            auVar27 = auVar27 & auVar28;
            uVar5 = (ushort)(SUB161(auVar27 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar27[0xf] >> 7) << 0xf;
            uVar14 = (uint)CONCAT11((char)(uVar5 >> 8),uVar5 == 0xffff);
          }
          else {
            uVar14 = 0;
          }
          if ((char)uVar14 == '\0') {
            pLVar20 = LogInstance();
            bVar11 = BCLog::Logger::WillLogCategoryLevel(pLVar20,ADDRMAN,Debug);
            if (bVar11) {
              logging_function._M_str = "Unserialize";
              logging_function._M_len = 0xb;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
              ;
              source_file._M_len = 0x54;
              ::LogPrintf_<>(logging_function,source_file,iVar23,in_R9,in_stack_fffffffffffffe38,
                             (char *)CONCAT44(uVar14,uVar29));
            }
          }
          uVar10 = local_168._8_8_;
          if (local_168._0_8_ != local_168._8_8_) {
            puVar1 = &this_03->mapInfo;
            args_1 = this_03->vvNew;
            piVar26 = (int *)local_168._0_8_;
            do {
              iVar13 = *piVar26;
              local_118._M_dataplus._M_p._0_4_ = piVar26[1];
              pmVar16 = std::__detail::
                        _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)puVar1,(key_type *)&local_118);
              bVar11 = CNetAddr::IsValid((CNetAddr *)pmVar16);
              if ((bVar11) && (pmVar16->nRefCount < 8)) {
                uVar15 = AddrInfo::GetBucketPosition(pmVar16,nKey,true,iVar13);
                if ((char)uVar14 == '\0') {
LAB_00458742:
                  iVar13 = AddrInfo::GetNewBucket
                                     (pmVar16,nKey,&pmVar16->source,this_03->m_netgroupman);
                  uVar15 = AddrInfo::GetBucketPosition(pmVar16,nKey,true,iVar13);
                  paiVar24 = (int (*) [64])((long)*args_1 + (ulong)(uint)(iVar13 << 8));
                  uVar21 = (ulong)uVar15;
                  if ((*paiVar24)[uVar21] != -1) goto LAB_00458799;
                }
                else {
                  paiVar24 = args_1 + iVar13;
                  uVar21 = (ulong)uVar15;
                  if ((*paiVar24)[uVar21] != -1) goto LAB_00458742;
                }
                (*paiVar24)[uVar21] = (int)local_118._M_dataplus._M_p;
                pmVar16->nRefCount = pmVar16->nRefCount + 1;
              }
LAB_00458799:
              piVar26 = piVar26 + 2;
            } while (piVar26 != (int *)uVar10);
          }
          local_16c = 0;
          p_Var9 = (this_03->mapInfo)._M_h._M_before_begin._M_nxt;
          args = this_03;
          while (p_Var9 != (_Hash_node_base *)0x0) {
            if ((*(char *)&p_Var9[0x11]._M_nxt == '\0') &&
               (*(int *)((long)&p_Var9[0x10]._M_nxt + 4) == 0)) {
              p_Var4 = p_Var9->_M_nxt;
              Delete(this_03,*(int *)&p_Var9[1]._M_nxt);
              local_16c = local_16c + 1;
              p_Var9 = p_Var4;
            }
            else {
              p_Var9 = p_Var9->_M_nxt;
            }
          }
          if (local_16c + local_148 != 0 &&
              SCARRY4(local_16c,local_148) == local_16c + local_148 < 0) {
            pLVar20 = LogInstance();
            bVar11 = BCLog::Logger::WillLogCategoryLevel(pLVar20,ADDRMAN,Debug);
            if (bVar11) {
              logging_function_00._M_str = "Unserialize";
              logging_function_00._M_len = 0xb;
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
              ;
              source_file_00._M_len = 0x54;
              LogPrintf_<int,int>(logging_function_00,source_file_00,(int)&local_16c,
                                  (LogFlags)&local_148,in_stack_fffffffffffffe38,
                                  (char *)CONCAT44(uVar14,uVar29),(int *)args,*args_1);
            }
          }
          local_170 = CheckAddrman(this_03);
          if (local_170 == 0) {
            if ((void *)local_168._0_8_ != (void *)0x0) {
              operator_delete((void *)local_168._0_8_,local_158 - local_168._0_8_);
            }
            std::unique_lock<std::mutex>::~unique_lock(&local_128);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              return;
            }
          }
          else {
            psVar22 = (string *)__cxa_allocate_exception(0x20);
            tinyformat::format<int>
                      (&local_118,"Corrupt data. Consistency check failed with code %s",&local_170);
            std::ios_base::failure[abi:cxx11]::failure(psVar22);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(psVar22,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
          }
        }
        else {
          psVar22 = (string *)__cxa_allocate_exception(0x20);
          local_f8._0_4_ = 0x4000;
          tinyformat::format<int,int>
                    ((string *)&local_d8.indirect_contents,
                     (tinyformat *)"Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
                     (char *)paiVar24,(int *)local_f8,in_R8);
          std::ios_base::failure[abi:cxx11]::failure(psVar22);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(psVar22,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
      }
      else {
        psVar22 = (string *)__cxa_allocate_exception(0x20);
        local_f8._0_4_ = 0x10000;
        tinyformat::format<int,int>
                  ((string *)&local_d8.indirect_contents,
                   (tinyformat *)"Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
                   (char *)piVar26,(int *)local_f8,in_R8);
        std::ios_base::failure[abi:cxx11]::failure(psVar22);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(psVar22,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
    }
    else {
      psVar22 = (string *)__cxa_allocate_exception(0x20);
      local_d8.direct[0] = (char)((uint)uVar29 >> 0x18);
      local_f8[0] = 4;
      tinyformat::format<unsigned_char,unsigned_char,char[13],unsigned_char>
                (&local_58,
                 (tinyformat *)
                 "Unsupported format of addrman database: %u. It is compatible with formats >=%u, but the maximum supported by this version of %s is %u."
                 ,local_d8.direct,&local_142,(uchar *)"Bitcoin Core",(char (*) [13])local_f8,
                 (uchar *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      std::ios_base::failure[abi:cxx11]::failure(psVar22);
      *(undefined ***)psVar22 = &PTR__failure_00b3a7c0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(psVar22,&InvalidAddrManVersionError::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Unserialize(Stream& s_)
{
    LOCK(cs);

    assert(vRandom.empty());

    Format format;
    s_ >> Using<CustomUintFormatter<1>>(format);

    const auto ser_params = (format >= Format::V3_BIP155 ? CAddress::V2_DISK : CAddress::V1_DISK);
    ParamsStream s{s_, ser_params};

    uint8_t compat;
    s >> compat;
    if (compat < INCOMPATIBILITY_BASE) {
        throw std::ios_base::failure(strprintf(
            "Corrupted addrman database: The compat value (%u) "
            "is lower than the expected minimum value %u.",
            compat, INCOMPATIBILITY_BASE));
    }
    const uint8_t lowest_compatible = compat - INCOMPATIBILITY_BASE;
    if (lowest_compatible > FILE_FORMAT) {
        throw InvalidAddrManVersionError(strprintf(
            "Unsupported format of addrman database: %u. It is compatible with formats >=%u, "
            "but the maximum supported by this version of %s is %u.",
            uint8_t{format}, lowest_compatible, PACKAGE_NAME, uint8_t{FILE_FORMAT}));
    }

    s >> nKey;
    s >> nNew;
    s >> nTried;
    int nUBuckets = 0;
    s >> nUBuckets;
    if (format >= Format::V1_DETERMINISTIC) {
        nUBuckets ^= (1 << 30);
    }

    if (nNew > ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nNew < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
                    nNew,
                    ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    if (nTried > ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nTried < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
                    nTried,
                    ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    // Deserialize entries from the new table.
    for (int n = 0; n < nNew; n++) {
        AddrInfo& info = mapInfo[n];
        s >> info;
        mapAddr[info] = n;
        info.nRandomPos = vRandom.size();
        vRandom.push_back(n);
        m_network_counts[info.GetNetwork()].n_new++;
    }
    nIdCount = nNew;

    // Deserialize entries from the tried table.
    int nLost = 0;
    for (int n = 0; n < nTried; n++) {
        AddrInfo info;
        s >> info;
        int nKBucket = info.GetTriedBucket(nKey, m_netgroupman);
        int nKBucketPos = info.GetBucketPosition(nKey, false, nKBucket);
        if (info.IsValid()
                && vvTried[nKBucket][nKBucketPos] == -1) {
            info.nRandomPos = vRandom.size();
            info.fInTried = true;
            vRandom.push_back(nIdCount);
            mapInfo[nIdCount] = info;
            mapAddr[info] = nIdCount;
            vvTried[nKBucket][nKBucketPos] = nIdCount;
            nIdCount++;
            m_network_counts[info.GetNetwork()].n_tried++;
        } else {
            nLost++;
        }
    }
    nTried -= nLost;

    // Store positions in the new table buckets to apply later (if possible).
    // An entry may appear in up to ADDRMAN_NEW_BUCKETS_PER_ADDRESS buckets,
    // so we store all bucket-entry_index pairs to iterate through later.
    std::vector<std::pair<int, int>> bucket_entries;

    for (int bucket = 0; bucket < nUBuckets; ++bucket) {
        int num_entries{0};
        s >> num_entries;
        for (int n = 0; n < num_entries; ++n) {
            int entry_index{0};
            s >> entry_index;
            if (entry_index >= 0 && entry_index < nNew) {
                bucket_entries.emplace_back(bucket, entry_index);
            }
        }
    }

    // If the bucket count and asmap checksum haven't changed, then attempt
    // to restore the entries to the buckets/positions they were in before
    // serialization.
    uint256 supplied_asmap_checksum{m_netgroupman.GetAsmapChecksum()};
    uint256 serialized_asmap_checksum;
    if (format >= Format::V2_ASMAP) {
        s >> serialized_asmap_checksum;
    }
    const bool restore_bucketing{nUBuckets == ADDRMAN_NEW_BUCKET_COUNT &&
        serialized_asmap_checksum == supplied_asmap_checksum};

    if (!restore_bucketing) {
        LogDebug(BCLog::ADDRMAN, "Bucketing method was updated, re-bucketing addrman entries from disk\n");
    }

    for (auto bucket_entry : bucket_entries) {
        int bucket{bucket_entry.first};
        const int entry_index{bucket_entry.second};
        AddrInfo& info = mapInfo[entry_index];

        // Don't store the entry in the new bucket if it's not a valid address for our addrman
        if (!info.IsValid()) continue;

        // The entry shouldn't appear in more than
        // ADDRMAN_NEW_BUCKETS_PER_ADDRESS. If it has already, just skip
        // this bucket_entry.
        if (info.nRefCount >= ADDRMAN_NEW_BUCKETS_PER_ADDRESS) continue;

        int bucket_position = info.GetBucketPosition(nKey, true, bucket);
        if (restore_bucketing && vvNew[bucket][bucket_position] == -1) {
            // Bucketing has not changed, using existing bucket positions for the new table
            vvNew[bucket][bucket_position] = entry_index;
            ++info.nRefCount;
        } else {
            // In case the new table data cannot be used (bucket count wrong or new asmap),
            // try to give them a reference based on their primary source address.
            bucket = info.GetNewBucket(nKey, m_netgroupman);
            bucket_position = info.GetBucketPosition(nKey, true, bucket);
            if (vvNew[bucket][bucket_position] == -1) {
                vvNew[bucket][bucket_position] = entry_index;
                ++info.nRefCount;
            }
        }
    }

    // Prune new entries with refcount 0 (as a result of collisions or invalid address).
    int nLostUnk = 0;
    for (auto it = mapInfo.cbegin(); it != mapInfo.cend(); ) {
        if (it->second.fInTried == false && it->second.nRefCount == 0) {
            const auto itCopy = it++;
            Delete(itCopy->first);
            ++nLostUnk;
        } else {
            ++it;
        }
    }
    if (nLost + nLostUnk > 0) {
        LogDebug(BCLog::ADDRMAN, "addrman lost %i new and %i tried addresses due to collisions or invalid addresses\n", nLostUnk, nLost);
    }

    const int check_code{CheckAddrman()};
    if (check_code != 0) {
        throw std::ios_base::failure(strprintf(
            "Corrupt data. Consistency check failed with code %s",
            check_code));
    }
}